

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O0

void __thiscall glslang::TSymbolTable::pushThis(TSymbolTable *this,TSymbol *thisSymbol)

{
  int iVar1;
  undefined4 extraout_var;
  size_type sVar2;
  TSymbolTableLevel *this_00;
  reference ppTVar3;
  TSymbolTableLevel *local_20;
  TSymbol *local_18;
  TSymbol *thisSymbol_local;
  TSymbolTable *this_local;
  
  local_18 = thisSymbol;
  thisSymbol_local = (TSymbol *)this;
  iVar1 = (*thisSymbol->_vptr_TSymbol[3])();
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          size((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               CONCAT44(extraout_var,iVar1));
  if (sVar2 == 0) {
    this_00 = (TSymbolTableLevel *)
              TSymbolTableLevel::operator_new((TSymbolTableLevel *)0x68,(size_t)thisSymbol);
    TSymbolTableLevel::TSymbolTableLevel(this_00);
    local_20 = this_00;
    std::vector<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>::
    push_back(&this->table,&local_20);
    updateUniqueIdLevelFlag(this);
    ppTVar3 = std::
              vector<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>::
              back(&this->table);
    TSymbolTableLevel::setThisLevel(*ppTVar3);
    insert(this,local_18);
    return;
  }
  __assert_fail("thisSymbol.getName().size() == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SymbolTable.h"
                ,0x2a5,"void glslang::TSymbolTable::pushThis(TSymbol &)");
}

Assistant:

void pushThis(TSymbol& thisSymbol)
    {
        assert(thisSymbol.getName().size() == 0);
        table.push_back(new TSymbolTableLevel);
        updateUniqueIdLevelFlag();
        table.back()->setThisLevel();
        insert(thisSymbol);
    }